

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O0

int32 Js::JavascriptNumber::DirectPowIntInt(bool *isOverflow,int32 x,int32 y)

{
  bool bVar1;
  int32 local_2c;
  int32 local_28;
  uint local_24;
  int32 result;
  uint32 uexp;
  int32 y_local;
  int32 x_local;
  bool *isOverflow_local;
  
  if (y < 0) {
    *isOverflow = true;
    isOverflow_local._4_4_ = 0;
  }
  else {
    local_28 = 1;
    local_24 = y;
    result = y;
    uexp = x;
    _y_local = isOverflow;
    do {
      if (((local_24 & 1) != 0) && (bVar1 = Int32Math::Mul(local_28,uexp,&local_28), bVar1)) {
        *_y_local = true;
        goto LAB_012c9ca9;
      }
      local_24 = local_24 >> 1;
      if (local_24 == 0) {
        *_y_local = false;
        goto LAB_012c9ca9;
      }
      bVar1 = Int32Math::Mul(uexp,uexp,(int32 *)&uexp);
    } while (!bVar1);
    *_y_local = true;
LAB_012c9ca9:
    if ((*_y_local & 1U) == 0) {
      local_2c = local_28;
    }
    else {
      local_2c = 0;
    }
    isOverflow_local._4_4_ = local_2c;
  }
  return isOverflow_local._4_4_;
}

Assistant:

int32 JavascriptNumber::DirectPowIntInt(bool* isOverflow, int32 x, int32 y)
    {
        if (y < 0)
        {
            *isOverflow = true;
            return 0;
        }

        uint32 uexp = static_cast<uint32>(y);
        int32 result = 1;

        while (true)
        {
            if ((uexp & 1) != 0)
            {
                if (Int32Math::Mul(result, x, &result))
                {
                    *isOverflow = true;
                    break;
                }
            }
            if ((uexp >>= 1) == 0)
            {
                *isOverflow = false;
                break;
            }
            if (Int32Math::Mul(x, x, &x))
            {
                *isOverflow = true;
                break;
            }
        }

        return *isOverflow ? 0 : result;
    }